

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imreadwrite.cpp
# Opt level: O0

Mat * cv::imread(string *path,int flags)

{
  uchar *puVar1;
  int in_EDX;
  Mat *in_RDI;
  int i_1;
  uchar *p_1;
  int i;
  uchar *p;
  Mat img;
  uchar *pixeldata;
  int c;
  int h;
  int w;
  int desired_channels;
  int _cols;
  Mat *pMVar2;
  int _rows;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  char *in_stack_ffffffffffffff98;
  Mat local_50;
  stbi_uc *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  if (in_EDX == -1) {
    local_18 = 0;
  }
  else if (in_EDX == 0) {
    local_18 = 1;
  }
  else {
    if (in_EDX != 1) {
      Mat::Mat(in_RDI);
      return in_RDI;
    }
    local_18 = 3;
  }
  pMVar2 = in_RDI;
  std::__cxx11::string::c_str();
  local_30 = stbi_load(in_stack_ffffffffffffff98,
                       (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88,
                       (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (int)((ulong)pMVar2 >> 0x20));
  if (local_30 == (stbi_uc *)0x0) {
    Mat::Mat(in_RDI);
    return pMVar2;
  }
  if (local_18 != 0) {
    local_24 = local_18;
  }
  Mat::Mat(&local_50);
  _cols = (int)pMVar2;
  _rows = (int)((ulong)pMVar2 >> 0x20);
  iVar3 = (int)((ulong)in_RDI >> 0x20);
  if (local_24 == 1) {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),_rows,_cols,
                iVar3);
  }
  else if (local_24 == 3) {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),_rows,_cols,
                iVar3);
  }
  else {
    if (local_24 != 4) {
      stbi_image_free((void *)0x1581f5);
      Mat::Mat(in_RDI);
      goto LAB_0015830f;
    }
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),_rows,_cols,
                iVar3);
  }
  memcpy(local_50.data,local_30,(long)local_1c * (long)local_20 * (long)local_24);
  stbi_image_free((void *)0x158242);
  if (local_24 == 3) {
    puVar1 = local_50.data;
    for (iVar3 = 0; iVar3 < local_1c * local_20; iVar3 = iVar3 + 1) {
      std::swap<unsigned_char>(puVar1,puVar1 + 2);
      puVar1 = puVar1 + 3;
    }
  }
  if (local_24 == 4) {
    puVar1 = local_50.data;
    for (iVar3 = 0; iVar3 < local_1c * local_20; iVar3 = iVar3 + 1) {
      std::swap<unsigned_char>(puVar1,puVar1 + 2);
      puVar1 = puVar1 + 4;
    }
  }
  Mat::Mat(in_RDI,&local_50);
LAB_0015830f:
  Mat::~Mat((Mat *)0x158319);
  return pMVar2;
}

Assistant:

Mat imread(const std::string& path, int flags)
{
    int desired_channels = 0;
    if (flags == IMREAD_UNCHANGED)
    {
        desired_channels = 0;
    }
    else if (flags == IMREAD_GRAYSCALE)
    {
        desired_channels = 1;
    }
    else if (flags == IMREAD_COLOR)
    {
        desired_channels = 3;
    }
    else
    {
        // unknown flags
        return Mat();
    }

    int w;
    int h;
    int c;
    unsigned char* pixeldata = stbi_load(path.c_str(), &w, &h, &c, desired_channels);
    if (!pixeldata)
    {
        // load failed
        return Mat();
    }

    if (desired_channels)
    {
        c = desired_channels;
    }

    // copy pixeldata to Mat
    Mat img;
    if (c == 1)
    {
        img.create(h, w, CV_8UC1);
    }
    else if (c == 3)
    {
        img.create(h, w, CV_8UC3);
    }
    else if (c == 4)
    {
        img.create(h, w, CV_8UC4);
    }
    else
    {
        // unexpected channels
        stbi_image_free(pixeldata);
        return Mat();
    }

    memcpy(img.data, pixeldata, static_cast<size_t>(w) * static_cast<size_t>(h) * static_cast<size_t>(c));

    stbi_image_free(pixeldata);

    //     // resolve exif orientation
    //     {
    //         std::ifstream ifs;
    //         ifs.open(filename.c_str(), std::ifstream::in);
    //
    //         if (ifs.good())
    //         {
    //             ExifReader exif_reader(ifs);
    //             if (exif_reader.parse())
    //             {
    //                 ExifEntry_t e = exif_reader.getTag(ORIENTATION);
    //                 int orientation = e.field_u16;
    //                 if (orientation >= 1 && orientation <= 8)
    //                     rotate_by_orientation(img, img, orientation);
    //             }
    //         }
    //
    //         ifs.close();
    //     }

    // rgb to bgr
    if (c == 3)
    {
        uchar* p = img.data;
        for (int i = 0; i < w * h; i++)
        {
            std::swap(p[0], p[2]);
            p += 3;
        }
    }
    if (c == 4)
    {
        uchar* p = img.data;
        for (int i = 0; i < w * h; i++)
        {
            std::swap(p[0], p[2]);
            p += 4;
        }
    }

    return img;
}